

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_59::InMemoryFile::read(InMemoryFile *this,int __fd,void *__buf,size_t __nbytes)

{
  Impl *pIVar1;
  Impl *pIVar2;
  uchar *__dest;
  uchar *puVar3;
  undefined4 in_register_00000034;
  unsigned_long local_60;
  size_t local_58;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> local_50;
  size_t readSize;
  undefined1 local_40 [8];
  Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  uint64_t offset_local;
  InMemoryFile *this_local;
  ArrayPtr<unsigned_char> buffer_local;
  
  lock.ptr = (Impl *)CONCAT44(in_register_00000034,__fd);
  this_local = (InMemoryFile *)__buf;
  buffer_local.ptr = (uchar *)__nbytes;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_40,&this->impl);
  pIVar2 = lock.ptr;
  pIVar1 = Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                     ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_40);
  if (pIVar2 < (Impl *)pIVar1->size) {
    local_58 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
    pIVar2 = Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_40);
    local_60 = pIVar2->size - (long)lock.ptr;
    local_50 = min<unsigned_long,unsigned_long>(&local_58,&local_60);
    __dest = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
    pIVar2 = Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_40);
    puVar3 = Array<unsigned_char>::begin(&pIVar2->bytes);
    memcpy(__dest,puVar3 + (long)lock.ptr,local_50);
    buffer_local.size_ = local_50;
  }
  else {
    buffer_local.size_ = 0;
  }
  readSize._0_4_ = 1;
  Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
            ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_40);
  return buffer_local.size_;
}

Assistant:

size_t read(uint64_t offset, ArrayPtr<byte> buffer) const override {
    auto lock = impl.lockShared();
    if (offset >= lock->size) {
      // Entirely out-of-range.
      return 0;
    }

    size_t readSize = kj::min(buffer.size(), lock->size - offset);
    memcpy(buffer.begin(), lock->bytes.begin() + offset, readSize);
    return readSize;
  }